

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::OurReader::recoverFromError(OurReader *this,TokenType skipUntilToken)

{
  bool bVar1;
  Token *token;
  int in_ESI;
  size_type in_RDI;
  deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_> *unaff_retaddr;
  Token skip;
  size_t errorCount;
  int local_30;
  undefined4 in_stack_fffffffffffffff0;
  
  token = (Token *)std::
                   deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>::
                   size((deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>
                         *)0x1ee15f);
  do {
    bVar1 = readToken((OurReader *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),token);
    if (!bVar1) {
      std::deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>::resize
                (unaff_retaddr,in_RDI);
    }
  } while ((local_30 != in_ESI) && (local_30 != 0));
  std::deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>::resize
            (unaff_retaddr,in_RDI);
  return false;
}

Assistant:

bool OurReader::recoverFromError(TokenType skipUntilToken) {
  size_t errorCount = errors_.size();
  Token skip;
  for (;;) {
    if (!readToken(skip))
      errors_.resize(errorCount); // discard errors caused by recovery
    if (skip.type_ == skipUntilToken || skip.type_ == tokenEndOfStream)
      break;
  }
  errors_.resize(errorCount);
  return false;
}